

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthCountMintermsPrecomp(void)

{
  undefined8 in_RAX;
  uint uVar1;
  ulong uVar2;
  uint *puVar3;
  undefined8 uStack_38;
  
  puVar3 = &DAT_00951a50;
  uVar2 = 0;
  uStack_38 = in_RAX;
  do {
    if ((uVar2 & 7) == 0) {
      putchar(10);
    }
    uVar1 = (uint)uVar2;
    uStack_38 = CONCAT44((&DAT_00951a50)[uVar1 & 0xf] << 0x18 |
                         (&DAT_00951a50)[uVar1 & 0x33] << 0x10 |
                         (&DAT_00951a50)[uVar1 & 0x55] << 8 | *puVar3,(undefined4)uStack_38);
    printf("0x");
    Kit_PrintHexadecimal(_stdout,(uint *)((long)&uStack_38 + 4),5);
    printf(", ");
    uVar2 = uVar2 + 1;
    puVar3 = puVar3 + 1;
  } while (uVar2 != 0x100);
  return;
}

Assistant:

void Kit_TruthCountMintermsPrecomp()
{
    int bit_count[256] = {
      0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
      3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8
    };
    unsigned i, uWord;
    for ( i = 0; i < 256; i++ )
    {
        if ( i % 8 == 0 )
            printf( "\n" );
        uWord  =  bit_count[i];
        uWord |= (bit_count[i & 0x55] <<  8);
        uWord |= (bit_count[i & 0x33] << 16);
        uWord |= (bit_count[i & 0x0f] << 24);
        printf( "0x" );
        Kit_PrintHexadecimal( stdout, &uWord, 5 );
        printf( ", " );
    }
}